

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_WolfAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  AActor *t1;
  PClassActor *this;
  BYTE *pBVar7;
  bool bVar8;
  PClass *pPVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  undefined4 extraout_var;
  PClass *pPVar13;
  VMValue *pVVar14;
  VMValue *pVVar15;
  PClassActor *pPVar16;
  byte bVar17;
  AActor *pAVar18;
  int iVar19;
  char *pcVar20;
  int iVar21;
  bool bVar22;
  double dVar23;
  double dVar24;
  DAngle angle;
  DAngle local_a0;
  FSoundID local_98;
  FName local_94;
  DVector3 BloodPos;
  DAngle local_60;
  DAngle local_58;
  DAngle local_50;
  DAngle local_48;
  DVector2 vec;
  
  pPVar9 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar20 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      t1 = *(AActor **)&param->field_0;
      if (t1 != (AActor *)0x0) {
        if ((t1->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar10 = (**(t1->super_DThinker).super_DObject._vptr_DObject)(t1);
          (t1->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar10);
        }
        pPVar13 = (t1->super_DThinker).super_DObject.Class;
        bVar22 = pPVar13 != (PClass *)0x0;
        if (pPVar13 != pPVar9 && bVar22) {
          do {
            pPVar13 = pPVar13->ParentClass;
            bVar22 = pPVar13 != (PClass *)0x0;
            if (pPVar13 == pPVar9) break;
          } while (pPVar13 != (PClass *)0x0);
        }
        if (!bVar22) {
          pcVar20 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003db8c9;
        }
      }
      if (numparam == 1) {
        pVVar14 = defaultparam->Array;
        if (defaultparam->Array[1].field_0.field_3.Type != '\0') {
          pcVar20 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003db8e8:
          __assert_fail(pcVar20,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x14bf,
                        "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      else {
        pVVar14 = param;
        if (param[1].field_0.field_3.Type != '\0') {
          pcVar20 = "(param[paramnum]).Type == REGT_INT";
          goto LAB_003db8e8;
        }
      }
      uVar4 = pVVar14[1].field_0.i;
      if (numparam < 3) {
        pVVar14 = defaultparam->Array;
        if (pVVar14[2].field_0.field_3.Type != '\0') {
          pcVar20 = "(defaultparam[paramnum]).Type == REGT_INT";
          goto LAB_003db907;
        }
      }
      else {
        pVVar14 = param;
        if (param[2].field_0.field_3.Type != '\0') {
          pcVar20 = "(param[paramnum]).Type == REGT_INT";
LAB_003db907:
          __assert_fail(pcVar20,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x14c0,
                        "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      iVar10 = pVVar14[2].field_0.i;
      if (numparam < 4) {
        pVVar14 = defaultparam->Array;
        if (pVVar14[3].field_0.field_3.Type != '\x01') {
          pcVar20 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
          goto LAB_003db926;
        }
      }
      else {
        pVVar14 = param;
        if (param[3].field_0.field_3.Type != '\x01') {
          pcVar20 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003db926:
          __assert_fail(pcVar20,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x14c1,
                        "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      dVar24 = pVVar14[3].field_0.f;
      if (numparam < 5) {
        pVVar14 = defaultparam->Array;
        if (pVVar14[4].field_0.field_3.Type != '\0') {
          pcVar20 = "(defaultparam[paramnum]).Type == REGT_INT";
          goto LAB_003db945;
        }
      }
      else {
        pVVar14 = param;
        if (param[4].field_0.field_3.Type != '\0') {
          pcVar20 = "(param[paramnum]).Type == REGT_INT";
LAB_003db945:
          __assert_fail(pcVar20,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x14c2,
                        "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      iVar19 = pVVar14[4].field_0.i;
      if (numparam < 6) {
        pVVar14 = defaultparam->Array;
        if (pVVar14[5].field_0.field_3.Type != '\0') {
          pcVar20 = "(defaultparam[paramnum]).Type == REGT_INT";
          goto LAB_003db964;
        }
      }
      else {
        pVVar14 = param;
        if (param[5].field_0.field_3.Type != '\0') {
          pcVar20 = "(param[paramnum]).Type == REGT_INT";
LAB_003db964:
          __assert_fail(pcVar20,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x14c3,
                        "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      iVar12 = pVVar14[5].field_0.i;
      if (numparam < 7) {
        pVVar14 = defaultparam->Array;
        if (pVVar14[6].field_0.field_3.Type != '\0') {
          pcVar20 = "(defaultparam[paramnum]).Type == REGT_INT";
          goto LAB_003db983;
        }
      }
      else {
        pVVar14 = param;
        if (param[6].field_0.field_3.Type != '\0') {
          pcVar20 = "(param[paramnum]).Type == REGT_INT";
LAB_003db983:
          __assert_fail(pcVar20,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x14c4,
                        "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      iVar5 = pVVar14[6].field_0.i;
      if (numparam < 8) {
        pVVar14 = defaultparam->Array;
        if (pVVar14[7].field_0.field_3.Type != '\0') {
          pcVar20 = "(defaultparam[paramnum]).Type == REGT_INT";
          goto LAB_003db9a2;
        }
      }
      else {
        pVVar14 = param;
        if (param[7].field_0.field_3.Type != '\0') {
          pcVar20 = "(param[paramnum]).Type == REGT_INT";
LAB_003db9a2:
          __assert_fail(pcVar20,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x14c5,
                        "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      iVar6 = pVVar14[7].field_0.i;
      if (numparam < 9) {
        pVVar14 = defaultparam->Array;
        if (pVVar14[8].field_0.field_3.Type != '\x01') {
          pcVar20 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
          goto LAB_003db9c1;
        }
      }
      else {
        pVVar14 = param;
        if (param[8].field_0.field_3.Type != '\x01') {
          pcVar20 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003db9c1:
          __assert_fail(pcVar20,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x14c6,
                        "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      dVar1 = pVVar14[8].field_0.f;
      if (numparam < 10) {
        pVVar14 = defaultparam->Array;
        if ((pVVar14[9].field_0.field_3.Type == '\x03') &&
           ((pVVar15 = pVVar14 + 9, pVVar14[9].field_0.field_1.atag == 1 ||
            ((pVVar15->field_0).field_1.a == (void *)0x0)))) goto LAB_003db3a7;
        pcVar20 = 
        "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
        ;
      }
      else {
        if ((param[9].field_0.field_3.Type == '\x03') &&
           ((pVVar15 = param + 9, param[9].field_0.field_1.atag == 1 ||
            ((pVVar15->field_0).field_1.a == (void *)0x0)))) {
LAB_003db3a7:
          pAVar18 = (t1->target).field_0.p;
          if (pAVar18 != (AActor *)0x0) {
            if (((pAVar18->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
              this = (PClassActor *)(pVVar15->field_0).field_1.a;
              pAVar18 = (t1->target).field_0.p;
              if ((pAVar18 != (AActor *)0x0) &&
                 (((pAVar18->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                (t1->target).field_0.p = (AActor *)0x0;
                pAVar18 = (AActor *)0x0;
              }
              bVar22 = P_CheckSight(t1,pAVar18,0);
              if (bVar22) {
                A_FaceTarget(t1);
                pAVar18 = (t1->target).field_0.p;
                if ((pAVar18 != (AActor *)0x0) &&
                   (((pAVar18->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                  (t1->target).field_0.p = (AActor *)0x0;
                  pAVar18 = (AActor *)0x0;
                }
                AActor::AngleTo((AActor *)&BloodPos,(t1->target).field_0.p,SUB81(t1,0));
                dVar2 = (pAVar18->Angles).Yaw.Degrees;
                pAVar18 = (t1->target).field_0.p;
                if ((pAVar18 != (AActor *)0x0) &&
                   (((pAVar18->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                  (t1->target).field_0.p = (AActor *)0x0;
                  pAVar18 = (AActor *)0x0;
                }
                bVar22 = P_CheckSight(pAVar18,t1,0);
                pAVar18 = (t1->target).field_0.p;
                if ((pAVar18 != (AActor *)0x0) &&
                   (((pAVar18->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                  (t1->target).field_0.p = (AActor *)0x0;
                }
                AActor::Vec2To((AActor *)&vec,t1);
                dVar23 = ABS(vec.X);
                if (ABS(vec.X) <= ABS(vec.Y)) {
                  dVar23 = ABS(vec.Y);
                }
                dVar24 = dVar24 * dVar23;
                iVar21 = ((uint)(byte)(21.333333333333332 <=
                                       ABS((double)SUB84((dVar2 - BloodPos.X) * 11930464.711111112 +
                                                         6755399441055744.0,0) *
                                           8.381903171539307e-08) | ~bVar22) << 3 | 0xfffffff0) *
                         (int)(dVar24 / (double)iVar12);
                pAVar18 = (t1->target).field_0.p;
                dVar2 = (pAVar18->Vel).X;
                dVar23 = (pAVar18->Vel).Y;
                dVar3 = (pAVar18->Vel).Z;
                iVar12 = iVar21 + 0x100;
                if (dVar1 <= dVar3 * dVar3 + dVar23 * dVar23 + dVar2 * dVar2) {
                  iVar12 = iVar21 + 0xa0;
                }
                bVar17 = (byte)((pAVar18->flags).Value >> 0x11) & 2;
                uVar11 = FRandom::GenRand32(&pr_cabullet);
                if ((int)(uVar11 & 0xff) < iVar12 >> bVar17) {
                  AActor::AngleTo((AActor *)&angle,(t1->target).field_0.p,SUB81(t1,0));
                  pAVar18 = (t1->target).field_0.p;
                  if ((pAVar18 != (AActor *)0x0) &&
                     (((pAVar18->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                    (t1->target).field_0.p = (AActor *)0x0;
                    pAVar18 = (AActor *)0x0;
                  }
                  local_48.Degrees = angle.Degrees;
                  AActor::Vec3Angle(&BloodPos,pAVar18,((t1->target).field_0.p)->radius,&local_48,
                                    ((t1->target).field_0.p)->Height * 0.5,false);
                  if ((uVar4 & 1) == 0) {
                    uVar11 = FRandom::GenRand32(&pr_cabullet);
                    iVar19 = (int)((long)(ulong)(uVar11 & 0xff) % (long)iVar19) + 1;
                  }
                  iVar19 = (iVar19 >> ((double)iVar5 <= dVar24)) >> ((double)iVar6 <= dVar24);
                  bVar22 = true;
                  if (((((t1->target).field_0.p)->flags).Value & 0x80000) == 0) {
                    bVar22 = ((((t1->target).field_0.p)->flags2).Value & 0x18000000) != 0;
                  }
                  bVar8 = (bool)(bVar22 ^ 1);
                  if ((this != (PClassActor *)0x0 & (byte)uVar4 >> 1) == 1) {
                    pPVar16 = PClassActor::GetReplacement(this,true);
                    pBVar7 = (pPVar16->super_PClass).Defaults;
                    if (((pBVar7[0x1c1] & 0x40) != 0) &&
                       (((((t1->target).field_0.p)->flags3).Value & 8) != 0)) {
                      iVar19 = 0;
                    }
                    iVar12 = *(int *)(pBVar7 + 0x404);
                    if (bVar22) {
                      local_50.Degrees = angle.Degrees;
                      local_58.Degrees = angle.Degrees;
                      bVar8 = false;
                      P_SpawnPuff(t1,this,&BloodPos,&local_50,&local_58,0,0,(AActor *)0x0);
                    }
                  }
                  else {
                    iVar19 = iVar19 >> ((byte)(((t1->target).field_0.p)->flags3).Value >> 2 & 2);
                    iVar12 = 0 >> bVar17;
                  }
                  if (iVar19 != 0) {
                    pAVar18 = (t1->target).field_0.p;
                    if ((pAVar18 != (AActor *)0x0) &&
                       (((pAVar18->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                      (t1->target).field_0.p = (AActor *)0x0;
                      pAVar18 = (AActor *)0x0;
                    }
                    local_60.Degrees = 0.0;
                    local_94.Index = iVar12;
                    iVar12 = P_DamageMobj(pAVar18,t1,t1,iVar19,&local_94,4,&local_60);
                    if (bVar8) {
                      local_a0.Degrees = angle.Degrees;
                      if (0 < iVar12) {
                        iVar19 = iVar12;
                      }
                      pAVar18 = (t1->target).field_0.p;
                      if ((pAVar18 != (AActor *)0x0) &&
                         (((pAVar18->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                        (t1->target).field_0.p = (AActor *)0x0;
                        pAVar18 = (AActor *)0x0;
                      }
                      P_SpawnBlood(&BloodPos,&local_a0,iVar19,pAVar18);
                      pAVar18 = (t1->target).field_0.p;
                      if ((pAVar18 != (AActor *)0x0) &&
                         (((pAVar18->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                        (t1->target).field_0.p = (AActor *)0x0;
                        pAVar18 = (AActor *)0x0;
                      }
                      P_TraceBleed(iVar19,pAVar18,t1);
                    }
                  }
                }
                local_98.ID = iVar10;
                S_Sound(t1,1,&local_98,1.0,1.0);
              }
            }
            else {
              (t1->target).field_0.p = (AActor *)0x0;
            }
          }
          return 0;
        }
        pcVar20 = 
        "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
        ;
      }
      __assert_fail(pcVar20,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x14c7,
                    "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar20 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003db8c9:
  __assert_fail(pcVar20,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x14be,
                "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_WolfAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF	(flags)				
	PARAM_SOUND_DEF	(sound)				
	PARAM_FLOAT_DEF	(snipe)				
	PARAM_INT_DEF	(maxdamage)			
	PARAM_INT_DEF	(blocksize)			
	PARAM_INT_DEF	(pointblank)		
	PARAM_INT_DEF	(longrange)			
	PARAM_FLOAT_DEF	(runspeed)			
	PARAM_CLASS_DEF	(pufftype, AActor)	

	if (!self->target)
		return 0;

	// Enemy can't see target
	if (!P_CheckSight(self, self->target))
		return 0;

	A_FaceTarget (self);

	// Target can dodge if it can see enemy
	DAngle angle = absangle(self->target->Angles.Yaw, self->target->AngleTo(self));
	bool dodge = (P_CheckSight(self->target, self) && angle < 30. * 256. / 360.);	// 30 byteangles ~ 21�

	// Distance check is simplistic
	DVector2 vec = self->Vec2To(self->target);
	double dx = fabs (vec.X);
	double dy = fabs (vec.Y);
	double dist = dx > dy ? dx : dy;

	// Some enemies are more precise
	dist *= snipe;

	// Convert distance into integer number of blocks
	int idist = int(dist / blocksize);

	// Now for the speed accuracy thingie
	double speed = self->target->Vel.LengthSquared();
	int hitchance = speed < runspeed ? 256 : 160;

	// Distance accuracy (factoring dodge)
	hitchance -= idist * (dodge ? 16 : 8);

	// While we're here, we may as well do something for this:
	if (self->target->flags & MF_SHADOW)
	{
		hitchance >>= 2;
	}

	// The attack itself
	if (pr_cabullet() < hitchance)
	{
		// Compute position for spawning blood/puff
		DAngle angle = self->target->AngleTo(self);
		DVector3 BloodPos = self->target->Vec3Angle(self->target->radius, angle, self->target->Height/2);

		int damage = flags & WAF_NORANDOM ? maxdamage : (1 + (pr_cabullet() % maxdamage));
		if (dist >= pointblank)
			damage >>= 1;
		if (dist >= longrange)
			damage >>= 1;
		FName mod = NAME_None;
		bool spawnblood = !((self->target->flags & MF_NOBLOOD) 
			|| (self->target->flags2 & (MF2_INVULNERABLE|MF2_DORMANT)));
		if (flags & WAF_USEPUFF && pufftype)
		{
			AActor *dpuff = GetDefaultByType(pufftype->GetReplacement());
			mod = dpuff->DamageType;

			if (dpuff->flags2 & MF2_THRUGHOST && self->target->flags3 & MF3_GHOST)
				damage = 0;
			
			if ((0 && dpuff->flags3 & MF3_PUFFONACTORS) || !spawnblood)
			{
				spawnblood = false;
				P_SpawnPuff(self, pufftype, BloodPos, angle, angle, 0);
			}
		}
		else if (self->target->flags3 & MF3_GHOST)
			damage >>= 2;
		if (damage)
		{
			int newdam = P_DamageMobj(self->target, self, self, damage, mod, DMG_THRUSTLESS);
			if (spawnblood)
			{
				P_SpawnBlood(BloodPos, angle, newdam > 0 ? newdam : damage, self->target);
				P_TraceBleed(newdam > 0 ? newdam : damage, self->target, self);
			}
		}
	}

	// And finally, let's play the sound
	S_Sound (self, CHAN_WEAPON, sound, 1, ATTN_NORM);
	return 0;
}